

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O3

SourceResultType __thiscall
duckdb::PhysicalIEJoin::GetData
          (PhysicalIEJoin *this,ExecutionContext *context,DataChunk *result,
          OperatorSourceInput *input)

{
  DataChunk *pDVar1;
  IEJoinGlobalSourceState *this_00;
  IEJoinLocalSourceState *lstate;
  pointer pLVar2;
  pointer pLVar3;
  ulong uVar4;
  sel_t *psVar5;
  pointer pGVar6;
  _Head_base<0UL,_duckdb::IEJoinUnion_*,_false> _Var7;
  const_reference pvVar8;
  bool *pbVar9;
  long lVar10;
  reference pvVar11;
  pointer pGVar12;
  reference pvVar13;
  ulong uVar14;
  ClientContext *client;
  size_type col_idx;
  ulong __n;
  idx_t result_count;
  size_type __n_00;
  BufferHandle local_60;
  BufferHandle local_48;
  
  client = (ClientContext *)context;
  pGVar6 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                       super_PhysicalJoin.super_CachingPhysicalOperator.super_PhysicalOperator.
                       sink_state);
  this_00 = (IEJoinGlobalSourceState *)input->global_state;
  lstate = (IEJoinLocalSourceState *)input->local_state;
  IEJoinGlobalSourceState::Initialize(this_00);
  _Var7._M_head_impl =
       (lstate->joiner).
       super_unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>._M_t.
       super___uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::IEJoinUnion_*,_std::default_delete<duckdb::IEJoinUnion>_>.
       super__Head_base<0UL,_duckdb::IEJoinUnion_*,_false>._M_head_impl;
  if (((_Var7._M_head_impl == (IEJoinUnion *)0x0) && (lstate->left_matches == (bool *)0x0)) &&
     (lstate->right_matches == (bool *)0x0)) {
    client = context->client;
    IEJoinGlobalSourceState::GetNextPair(this_00,client,lstate);
    _Var7._M_head_impl =
         (lstate->joiner).
         super_unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>._M_t.
         super___uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::IEJoinUnion_*,_std::default_delete<duckdb::IEJoinUnion>_>.
         super__Head_base<0UL,_duckdb::IEJoinUnion_*,_false>._M_head_impl;
  }
  if (_Var7._M_head_impl != (IEJoinUnion *)0x0) {
    do {
      ResolveComplexJoin(this,(ExecutionContext *)client,result,(LocalSourceState *)lstate);
      if (result->count != 0) {
        return false;
      }
      client = context->client;
      ::std::__uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>::reset
                ((__uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_> *)
                 &lstate->joiner,(pointer)0x0);
      LOCK();
      (this_00->completed).super___atomic_base<unsigned_long>._M_i =
           (this_00->completed).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
      IEJoinGlobalSourceState::GetNextPair(this_00,client,lstate);
    } while ((lstate->joiner).
             super_unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>._M_t.
             super___uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::IEJoinUnion_*,_std::default_delete<duckdb::IEJoinUnion>_>
             .super__Head_base<0UL,_duckdb::IEJoinUnion_*,_false>._M_head_impl != (IEJoinUnion *)0x0
            );
  }
  pvVar8 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                     (&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                       super_PhysicalJoin.super_CachingPhysicalOperator.super_PhysicalOperator.
                       children,0);
  pLVar2 = (pvVar8->_M_data->types).
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar3 = (pvVar8->_M_data->types).
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __n = ((long)pLVar3 - (long)pLVar2 >> 3) * -0x5555555555555555;
  pbVar9 = lstate->left_matches;
  if (pbVar9 != (bool *)0x0) {
LAB_015471ca:
    uVar14 = lstate->outer_idx;
    uVar4 = lstate->outer_count;
    if (uVar4 <= uVar14) goto LAB_0154721a;
    psVar5 = (lstate->true_sel).sel_vector;
    result_count = 0;
    do {
      if (pbVar9[uVar14] == false) {
        psVar5[result_count] = (sel_t)uVar14;
        result_count = result_count + 1;
        if (0x7ff < result_count) {
          lstate->outer_idx = uVar14 + 1;
          goto LAB_015472c8;
        }
      }
      uVar14 = uVar14 + 1;
      lstate->outer_idx = uVar14;
    } while (uVar4 != uVar14);
    if (result_count == 0) goto LAB_0154721a;
LAB_015472c8:
    pDVar1 = &lstate->unprojected;
    DataChunk::Reset(pDVar1);
    pvVar11 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
                            *)(pGVar6 + 1),0);
    pGVar12 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
              ::operator->(pvVar11);
    PhysicalRangeJoin::SliceSortedPayload
              (&local_48,pDVar1,&pGVar12->global_sort_state,lstate->left_block_index,
               &lstate->true_sel,result_count,0);
    BufferHandle::~BufferHandle(&local_48);
    lVar10 = (long)(lstate->unprojected).data.
                   super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(lstate->unprojected).data.
                   super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_start;
    for (; __n < (ulong)((lVar10 >> 3) * 0x4ec4ec4ec4ec4ec5); __n = __n + 1) {
      pvVar13 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,__n);
      Vector::SetVectorType(pvVar13,CONSTANT_VECTOR);
      pvVar13 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,__n);
      ConstantVector::SetNull(pvVar13,true);
      lVar10 = (long)(lstate->unprojected).data.
                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(lstate->unprojected).data.
                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_start;
    }
    goto LAB_01547445;
  }
LAB_01547235:
  pbVar9 = lstate->right_matches;
  if (pbVar9 != (bool *)0x0) {
    do {
      uVar14 = lstate->outer_idx;
      uVar4 = lstate->outer_count;
      if (uVar14 < uVar4) {
        psVar5 = (lstate->true_sel).sel_vector;
        result_count = 0;
        do {
          if (pbVar9[uVar14] == false) {
            psVar5[result_count] = (sel_t)uVar14;
            result_count = result_count + 1;
            if (0x7ff < result_count) {
              lstate->outer_idx = uVar14 + 1;
              goto LAB_015473a0;
            }
          }
          uVar14 = uVar14 + 1;
          lstate->outer_idx = uVar14;
        } while (uVar4 != uVar14);
        if (result_count != 0) {
LAB_015473a0:
          pDVar1 = &lstate->unprojected;
          DataChunk::Reset(pDVar1);
          pvVar11 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
                                  *)(pGVar6 + 1),1);
          pGVar12 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                    ::operator->(pvVar11);
          PhysicalRangeJoin::SliceSortedPayload
                    (&local_60,pDVar1,&pGVar12->global_sort_state,lstate->right_block_index,
                     &lstate->true_sel,result_count,__n);
          BufferHandle::~BufferHandle(&local_60);
          if (pLVar3 != pLVar2) {
            __n_00 = 0;
            do {
              pvVar13 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,__n_00);
              Vector::SetVectorType(pvVar13,CONSTANT_VECTOR);
              pvVar13 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,__n_00);
              ConstantVector::SetNull(pvVar13,true);
              __n_00 = __n_00 + 1;
            } while (__n + (__n == 0) != __n_00);
          }
LAB_01547445:
          PhysicalRangeJoin::ProjectResult
                    (&this->super_PhysicalRangeJoin,&lstate->unprojected,result);
          result->count = result_count;
          DataChunk::Verify(result);
          break;
        }
      }
      IEJoinGlobalSourceState::GetNextPair(this_00,context->client,lstate);
      pbVar9 = lstate->right_matches;
    } while (pbVar9 != (bool *)0x0);
  }
  return result->count == 0;
LAB_0154721a:
  IEJoinGlobalSourceState::GetNextPair(this_00,context->client,lstate);
  pbVar9 = lstate->left_matches;
  if (pbVar9 == (bool *)0x0) goto LAB_01547235;
  goto LAB_015471ca;
}

Assistant:

SourceResultType PhysicalIEJoin::GetData(ExecutionContext &context, DataChunk &result,
                                         OperatorSourceInput &input) const {
	auto &ie_sink = sink_state->Cast<IEJoinGlobalState>();
	auto &ie_gstate = input.global_state.Cast<IEJoinGlobalSourceState>();
	auto &ie_lstate = input.local_state.Cast<IEJoinLocalSourceState>();

	ie_gstate.Initialize();

	if (!ie_lstate.joiner && !ie_lstate.left_matches && !ie_lstate.right_matches) {
		ie_gstate.GetNextPair(context.client, ie_lstate);
	}

	// Process INNER results
	while (ie_lstate.joiner) {
		ResolveComplexJoin(context, result, ie_lstate);

		if (result.size()) {
			return SourceResultType::HAVE_MORE_OUTPUT;
		}

		ie_gstate.PairCompleted(context.client, ie_lstate);
	}

	// Process LEFT OUTER results
	const auto left_cols = children[0].get().GetTypes().size();
	while (ie_lstate.left_matches) {
		const idx_t count = ie_lstate.SelectOuterRows(ie_lstate.left_matches);
		if (!count) {
			ie_gstate.GetNextPair(context.client, ie_lstate);
			continue;
		}
		auto &chunk = ie_lstate.unprojected;
		chunk.Reset();
		SliceSortedPayload(chunk, ie_sink.tables[0]->global_sort_state, ie_lstate.left_block_index, ie_lstate.true_sel,
		                   count);

		// Fill in NULLs to the right
		for (auto col_idx = left_cols; col_idx < chunk.ColumnCount(); ++col_idx) {
			chunk.data[col_idx].SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(chunk.data[col_idx], true);
		}

		ProjectResult(chunk, result);
		result.SetCardinality(count);
		result.Verify();

		return result.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
	}

	// Process RIGHT OUTER results
	while (ie_lstate.right_matches) {
		const idx_t count = ie_lstate.SelectOuterRows(ie_lstate.right_matches);
		if (!count) {
			ie_gstate.GetNextPair(context.client, ie_lstate);
			continue;
		}

		auto &chunk = ie_lstate.unprojected;
		chunk.Reset();
		SliceSortedPayload(chunk, ie_sink.tables[1]->global_sort_state, ie_lstate.right_block_index, ie_lstate.true_sel,
		                   count, left_cols);

		// Fill in NULLs to the left
		for (idx_t col_idx = 0; col_idx < left_cols; ++col_idx) {
			chunk.data[col_idx].SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(chunk.data[col_idx], true);
		}

		ProjectResult(chunk, result);
		result.SetCardinality(count);
		result.Verify();

		break;
	}

	return result.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
}